

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_options.h
# Opt level: O1

void __thiscall google::protobuf::compiler::csharp::Options::Options(Options *this)

{
  (this->file_extension)._M_dataplus._M_p = (pointer)&(this->file_extension).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,".cs","");
  (this->base_namespace)._M_dataplus._M_p = (pointer)&(this->base_namespace).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->base_namespace,"");
  this->base_namespace_specified = false;
  this->internal_access = false;
  this->serializable = false;
  return;
}

Assistant:

Options() :
      file_extension(".cs"),
      base_namespace(""),
      base_namespace_specified(false),
      internal_access(false),
      serializable(false) {
  }